

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O0

string * __thiscall ZXing::Content::render_abi_cxx11_(Content *this,bool withECI)

{
  anon_class_40_5_a4efd04e func;
  bool bVar1;
  byte in_DL;
  long in_RSI;
  Content *in_RDI;
  CharacterSet fallbackCS;
  ECI lastECI;
  string *res;
  Content *in_stack_ffffffffffffff50;
  Content *this_00;
  Content *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_38 [38];
  undefined1 local_12;
  byte local_11 [17];
  
  local_11[0] = in_DL & 1;
  this_00 = in_RDI;
  bVar1 = empty((Content *)0x220c01);
  if ((bVar1) || (bVar1 = canProcess(in_stack_ffffffffffffff50), !bVar1)) {
    std::__cxx11::string::string((string *)this_00);
  }
  else {
    local_12 = 0;
    std::__cxx11::string::string((string *)this_00);
    if ((local_11[0] & 1) != 0) {
      SymbologyIdentifier::toString_abi_cxx11_
                ((SymbologyIdentifier *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (bool)in_stack_ffffffffffffffb7);
      std::__cxx11::string::operator=((string *)this_00,local_38);
      std::__cxx11::string::~string(local_38);
    }
    if (((*(byte *)(in_RSI + 0x35) & 1) == 0) && (*(char *)(in_RSI + 0x34) == '\0')) {
      guessEncoding(in_stack_ffffffffffffff98);
    }
    func.withECI = (bool *)&stack0xffffffffffffffb7;
    func.fallbackCS = (CharacterSet *)in_RSI;
    func.lastECI = (ECI *)local_11;
    func.res = (string *)&stack0xffffffffffffffb8;
    func.this = this_00;
    ForEachECIBlock<ZXing::Content::render[abi:cxx11](bool)const::__0>(this_00,func);
  }
  return (string *)in_RDI;
}

Assistant:

std::string Content::render(bool withECI) const
{
	if (empty() || !canProcess())
		return {};

	std::string res;
	if (withECI)
		res = symbology.toString(true);
	ECI lastECI = ECI::Unknown;
	auto fallbackCS = defaultCharset;
	if (!hasECI && fallbackCS == CharacterSet::Unknown)
		fallbackCS = guessEncoding();

	ForEachECIBlock([&](ECI eci, int begin, int end) {
		// first determine how to decode the content (choose character set)
		//  * eci == ECI::Unknown implies !hasECI and we guess
		//  * if !IsText(eci) the ToCharcterSet(eci) will return Unknown and we decode as binary
		CharacterSet cs = eci == ECI::Unknown ? fallbackCS : ToCharacterSet(eci);

		if (withECI) {
			// then find the eci to report back in the ECI designator
			if (IsText(ToECI(cs))) // everything decoded as text is reported as utf8
				eci = ECI::UTF8;
			else if (eci == ECI::Unknown) // implies !hasECI and fallbackCS is Unknown or Binary
				eci = ECI::Binary;

			if (lastECI != eci)
				res += ToString(eci);
			lastECI = eci;

			std::string tmp;
			TextDecoder::Append(tmp, bytes.data() + begin, end - begin, cs);
			for (auto c : tmp) {
				res += c;
				if (c == '\\') // in the ECI protocol a '\' has to be doubled
					res += c;
			}
		} else {
			TextDecoder::Append(res, bytes.data() + begin, end - begin, cs);
		}
	});

	return res;
}